

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O0

bool Genetic::avaliate_population(void)

{
  bool bVar1;
  reference ppVar2;
  double dVar3;
  _Self local_28;
  _Self local_20;
  iterator it;
  double last_weight;
  
  it._M_node = (_List_node_base *)0x0;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::begin
                 (&solutions_abi_cxx11_);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::end
                   (&solutions_abi_cxx11_);
    bVar1 = std::operator!=(&local_20,&local_28);
    dVar3 = max_weight;
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&local_20);
    dVar3 = (dVar3 - ppVar2->first->weight) + (double)it._M_node;
    ppVar2 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&local_20);
    ppVar2->second = dVar3;
    ppVar2 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&local_20);
    it._M_node = (_List_node_base *)ppVar2->second;
    std::_List_iterator<std::pair<Solution_*,_double>_>::operator++(&local_20);
  }
  ticket_max = (double)it._M_node;
  return (int)(double)it._M_node != 0;
}

Assistant:

bool Genetic::avaliate_population()
{
	double last_weight = 0;
	for (auto it = solutions.begin(); it != solutions.end(); ++it)
	{
		(*it).second = (max_weight - (*it).first->weight) + last_weight;
		last_weight = (*it).second;
	}
	ticket_max = last_weight;
	if (static_cast<int>(ticket_max) == 0)
	{
		return false;
	}
	return true;
}